

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O2

void clenshaw_curtis_compute(int n,double *x,double *w)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  if (n < 1) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"CLENSHAW_CURTIS_COMPUTE - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  N < 1.\n");
    exit(1);
  }
  if (n == 1) {
    *x = 0.0;
    *w = 2.0;
    return;
  }
  uVar7 = (ulong)(uint)n;
  pvVar2 = operator_new__(uVar7 * 8);
  uVar1 = n - 1;
  dVar9 = (double)(int)uVar1;
  iVar6 = 1;
  for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    *(double *)((long)pvVar2 + uVar4 * 8) = ((double)(iVar6 + -1) * 3.141592653589793) / dVar9;
    iVar6 = iVar6 + 1;
  }
  for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    dVar10 = cos(*(double *)((long)pvVar2 + uVar4 * 8));
    x[uVar4] = dVar10;
  }
  for (uVar4 = 0; uVar4 != uVar7; uVar4 = uVar4 + 1) {
    w[uVar4] = 1.0;
    uVar5 = 2;
    iVar6 = 4;
    dVar10 = 1.0;
    for (iVar8 = 1; iVar8 - (uVar1 >> 1) != 1; iVar8 = iVar8 + 1) {
      dVar11 = cos((double)uVar5 * *(double *)((long)pvVar2 + uVar4 * 8));
      dVar10 = dVar10 - (dVar11 * *(double *)(&DAT_00225610 + (ulong)(uVar5 - n == -1) * 8)) /
                        (double)(iVar6 * iVar8 + -1);
      w[uVar4] = dVar10;
      iVar6 = iVar6 + 4;
      uVar5 = uVar5 + 2;
    }
  }
  *w = *w / dVar9;
  for (lVar3 = 0; uVar7 - 2 != lVar3; lVar3 = lVar3 + 1) {
    w[lVar3 + 1] = (w[lVar3 + 1] + w[lVar3 + 1]) / dVar9;
  }
  w[uVar1] = w[uVar1] / dVar9;
  operator_delete__(pvVar2);
  return;
}

Assistant:

void clenshaw_curtis_compute ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    CLENSHAW_CURTIS_COMPUTE computes a Clenshaw Curtis quadrature rule.
//
//  Discussion:
//
//    This method uses a direct approach.  The paper by Waldvogel
//    exhibits a more efficient approach using Fourier transforms.
//
//    The integral:
//
//      Integral ( -1 <= X <= 1 ) F(X) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= ORDER ) W(I) * F ( X(I) )
//
//    The abscissas for the rule of order ORDER can be regarded 
//    as the cosines of equally spaced angles between 180 and 0 degrees:
//
//      X(I) = cos ( ( I - 1 ) * PI / ( ORDER - 1 ) )
//
//    except for the basic case ORDER = 1, when
//
//      X(1) = 0.
//
//    A Clenshaw-Curtis rule that uses ORDER points will integrate
//    exactly all polynomials of degrees 0 through ORDER-1.  If ORDER
//    is odd, then by symmetry the polynomial of degree ORDER will
//    also be integrated exactly.
//
//    If the value of ORDER is increased in a sensible way, then
//    the new set of abscissas will include the old ones.  One such
//    sequence would be ORDER(K) = 2*K+1 for K = 0, 1, 2, ...
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    18 October 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Charles Clenshaw, Alan Curtis,
//    A Method for Numerical Integration on an Automatic Computer,
//    Numerische Mathematik,
//    Volume 2, Number 1, December 1960, pages 197-205.
//
//    Philip Davis, Philip Rabinowitz,
//    Methods of Numerical Integration,
//    Second Edition,
//    Dover, 2007,
//    ISBN: 0486453391,
//    LC: QA299.3.D28.
//
//    Joerg Waldvogel,
//    Fast Construction of the Fejer and Clenshaw-Curtis Quadrature Rules,
//    BIT Numerical Mathematics,
//    Volume 43, Number 1, 2003, pages 1-18.
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  double b;
  int i;
  int j;
  const double r8_pi = 3.141592653589793;
  double *theta;

  if ( n < 1 )
  {
    std::cerr << "\n";
    std::cerr << "CLENSHAW_CURTIS_COMPUTE - Fatal error!\n";
    std::cerr << "  N < 1.\n";
    exit ( 1 );
  }

  if ( n == 1 )
  {
    x[0] = 0.0;
    w[0] = 2.0;
    return;
  }

  theta = new double[n];

  for ( i = 1; i <= n; i++ )
  {
    theta[i-1] = double( i - 1 ) * r8_pi 
               / double( n - 1 );
  }

  for ( i = 0; i < n; i++ )
  {
    x[i] = cos ( theta[i] );
  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = 1.0;

    for ( j = 1; j <= ( ( n - 1 ) / 2 ); j++ )
    {
      if ( 2 * j == ( n - 1 ) )
      {
        b = 1.0;
      }
      else
      {
        b = 2.0;
      }

      w[i] = w[i] - b * cos ( 2.0 * double( j ) * theta[i] ) 
           / double( 4 * j * j - 1 );
    }
  }

  w[0] = w[0] / double( n - 1 );
  for ( i = 2; i <= n-1; i++ )
  {
    w[i-1] = 2.0 * w[i-1] / double( n - 1 );
  }
  w[n-1] = w[n-1] / double( n - 1 );

  delete [] theta;

  return;
}